

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::GetNavInputAmount(ImGuiNavInput n,ImGuiInputReadMode mode)

{
  float t1;
  int iVar1;
  float t;
  ImGuiContext_conflict *g;
  ImGuiInputReadMode mode_local;
  ImGuiNavInput n_local;
  
  if (mode == ImGuiInputReadMode_Down) {
    mode_local = (ImGuiInputReadMode)(GImGui->IO).NavInputs[n];
  }
  else {
    t1 = (GImGui->IO).NavInputsDownDuration[n];
    if ((0.0 <= t1) || (mode != ImGuiInputReadMode_Released)) {
      if (0.0 <= t1) {
        if (mode == ImGuiInputReadMode_Pressed) {
          mode_local = -(uint)(t1 == 0.0) & 0x3f800000;
        }
        else if (mode == ImGuiInputReadMode_Repeat) {
          iVar1 = CalcTypematicRepeatAmount
                            (t1 - (GImGui->IO).DeltaTime,t1,(GImGui->IO).KeyRepeatDelay * 0.72,
                             (GImGui->IO).KeyRepeatRate * 0.8);
          mode_local = (ImGuiInputReadMode)(float)iVar1;
        }
        else if (mode == ImGuiInputReadMode_RepeatSlow) {
          iVar1 = CalcTypematicRepeatAmount
                            (t1 - (GImGui->IO).DeltaTime,t1,(GImGui->IO).KeyRepeatDelay * 1.25,
                             (GImGui->IO).KeyRepeatRate * 2.0);
          mode_local = (ImGuiInputReadMode)(float)iVar1;
        }
        else if (mode == ImGuiInputReadMode_RepeatFast) {
          iVar1 = CalcTypematicRepeatAmount
                            (t1 - (GImGui->IO).DeltaTime,t1,(GImGui->IO).KeyRepeatDelay * 0.72,
                             (GImGui->IO).KeyRepeatRate * 0.3);
          mode_local = (ImGuiInputReadMode)(float)iVar1;
        }
        else {
          mode_local = ImGuiInputReadMode_Down;
        }
      }
      else {
        mode_local = ImGuiInputReadMode_Down;
      }
    }
    else {
      mode_local = -(uint)(0.0 <= (GImGui->IO).NavInputsDownDurationPrev[n]) & 0x3f800000;
    }
  }
  return (float)mode_local;
}

Assistant:

float ImGui::GetNavInputAmount(ImGuiNavInput n, ImGuiInputReadMode mode)
{
    ImGuiContext& g = *GImGui;
    if (mode == ImGuiInputReadMode_Down)
        return g.IO.NavInputs[n];                         // Instant, read analog input (0.0f..1.0f, as provided by user)

    const float t = g.IO.NavInputsDownDuration[n];
    if (t < 0.0f && mode == ImGuiInputReadMode_Released)  // Return 1.0f when just released, no repeat, ignore analog input.
        return (g.IO.NavInputsDownDurationPrev[n] >= 0.0f ? 1.0f : 0.0f);
    if (t < 0.0f)
        return 0.0f;
    if (mode == ImGuiInputReadMode_Pressed)               // Return 1.0f when just pressed, no repeat, ignore analog input.
        return (t == 0.0f) ? 1.0f : 0.0f;
    if (mode == ImGuiInputReadMode_Repeat)
        return (float)CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, g.IO.KeyRepeatDelay * 0.72f, g.IO.KeyRepeatRate * 0.80f);
    if (mode == ImGuiInputReadMode_RepeatSlow)
        return (float)CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, g.IO.KeyRepeatDelay * 1.25f, g.IO.KeyRepeatRate * 2.00f);
    if (mode == ImGuiInputReadMode_RepeatFast)
        return (float)CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, g.IO.KeyRepeatDelay * 0.72f, g.IO.KeyRepeatRate * 0.30f);
    return 0.0f;
}